

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.h
# Opt level: O0

void __thiscall
wabt::BlockExprBase<(wabt::ExprType)26>::~BlockExprBase(BlockExprBase<(wabt::ExprType)26> *this)

{
  BlockExprBase<(wabt::ExprType)26> *this_local;
  
  ~BlockExprBase(this);
  operator_delete(this);
  return;
}

Assistant:

explicit BlockExprBase(const Location& loc = Location())
      : ExprMixin<TypeEnum>(loc) {}